

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O1

void __thiscall nuraft::buffer_serializer::pos(buffer_serializer *this,size_t new_pos)

{
  size_t sVar1;
  overflow_error *this_00;
  
  sVar1 = buffer::size(this->buf_);
  if (new_pos <= sVar1) {
    this->pos_ = new_pos;
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"invalid position");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer_serializer::pos(size_t new_pos) {
    if (new_pos > buf_.size()) throw std::overflow_error("invalid position");
    pos_ = new_pos;
}